

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider.cpp
# Opt level: O0

Provider * parseProvider(QString *filename)

{
  PatternOptions options;
  PatternOptions options_00;
  PatternOptions options_01;
  PatternOptions options_02;
  QLatin1StringView s_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  QFlags<QIODeviceBase::OpenModeFlag> QVar7;
  uint uVar8;
  int iVar9;
  quint32 qVar10;
  char *pcVar11;
  int *piVar12;
  int __oflag;
  QString *in_RSI;
  Provider *in_RDI;
  long in_FS_OFFSET;
  int lineNumber;
  bool parsingFlags;
  bool parsingEnum;
  bool parsingPrefixText;
  Provider *provider;
  char16_t *str;
  char16_t *str_1;
  char16_t *str_2;
  char16_t *str_3;
  char16_t *str_4;
  char16_t *str_5;
  QStringList args;
  QString argsString;
  QString name;
  QRegularExpressionMatch match;
  EnumValue value_1;
  EnumValue value;
  QRegularExpressionMatch m_1;
  QRegularExpressionMatch m;
  QRegularExpressionMatch match_1;
  QString line;
  int maxEnumValue;
  int minEnumValue;
  int currentEnumValue;
  TraceFlags currentFlags;
  QTextStream s;
  QFile f;
  FlagValue value_2;
  TraceEnum currentEnum;
  rvalue_ref in_stack_fffffffffffff838;
  MatchOption flags;
  enum_type in_stack_fffffffffffff840;
  CaseSensitivity in_stack_fffffffffffff844;
  QIODevice *in_stack_fffffffffffff848;
  CaseSensitivity cs;
  QIODevice *in_stack_fffffffffffff850;
  undefined4 in_stack_fffffffffffff858;
  undefined2 in_stack_fffffffffffff85c;
  QChar in_stack_fffffffffffff85e;
  QFileInfo *in_stack_fffffffffffff860;
  undefined4 in_stack_fffffffffffff868;
  CaseSensitivity in_stack_fffffffffffff86c;
  undefined1 *in_stack_fffffffffffff870;
  QString *in_stack_fffffffffffff878;
  CaseSensitivity in_stack_fffffffffffff880;
  undefined1 in_stack_fffffffffffff884;
  byte in_stack_fffffffffffff885;
  byte in_stack_fffffffffffff886;
  byte in_stack_fffffffffffff887;
  char *in_stack_fffffffffffff888;
  CaseSensitivity in_stack_fffffffffffff890;
  uint in_stack_fffffffffffff894;
  QStringList *in_stack_fffffffffffff898;
  Provider *provider_00;
  CaseSensitivity local_734;
  QChar local_5f2;
  undefined8 local_5f0;
  undefined8 local_5e8;
  undefined8 local_5e0;
  undefined8 local_5d8;
  undefined8 local_5d0;
  undefined8 local_5c8;
  undefined8 local_5c0;
  undefined8 local_5b8;
  undefined8 local_5b0;
  undefined8 local_5a0;
  int local_520;
  undefined4 local_51c;
  QArrayDataPointer<char16_t> local_4b8 [6];
  undefined8 local_428;
  undefined8 local_420;
  undefined8 local_418;
  ulong local_410 [10];
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  int local_3a8 [4];
  undefined8 local_398;
  QArrayDataPointer<char16_t> local_390 [2];
  undefined8 local_358;
  QChar local_34a [25];
  undefined1 local_318 [104];
  undefined8 local_2b0;
  QLatin1StringView local_2a8;
  QLatin1StringView local_298;
  QLatin1StringView local_288;
  QLatin1StringView local_278;
  QString local_250;
  int local_234;
  int local_230;
  int local_22c;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  QArrayDataPointer<char16_t> local_1d0 [2];
  QArrayDataPointer<char16_t> local_198 [2];
  QArrayDataPointer<char16_t> local_160 [2];
  QArrayDataPointer<char16_t> local_128 [2];
  undefined8 local_f8;
  QString local_f0 [3];
  QFile local_a8;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined1 local_78 [56];
  undefined1 local_40 [24];
  undefined1 auStack_28 [24];
  int local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.super_QFileDevice.super_QIODevice._vptr_QIODevice = (_func_int **)0xaaaaaaaaaaaaaaaa;
  local_a8.super_QFileDevice.super_QIODevice.d_ptr._M_t.
  super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
  super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
  super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
       (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
       (__uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>)0xaaaaaaaaaaaaaaaa
  ;
  provider_00 = in_RDI;
  QFile::QFile((QFile *)in_stack_fffffffffffff850,(QString *)in_stack_fffffffffffff848);
  QVar7 = operator|(in_stack_fffffffffffff844,in_stack_fffffffffffff840);
  uVar8 = QFile::open(&local_a8,
                      (char *)(ulong)(uint)QVar7.
                                           super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>
                                           .super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i,
                      __oflag);
  if ((uVar8 & 1) == 0) {
    QtPrivate::asString(in_RSI);
    QString::toLocal8Bit
              ((QString *)
               CONCAT26(in_stack_fffffffffffff85e.ucs,
                        CONCAT24(in_stack_fffffffffffff85c,in_stack_fffffffffffff858)));
    in_stack_fffffffffffff898 = (QStringList *)QByteArray::constData((QByteArray *)0x119d98);
    QIODevice::errorString(in_stack_fffffffffffff850);
    QtPrivate::asString(local_f0);
    QString::toLocal8Bit
              ((QString *)
               CONCAT26(in_stack_fffffffffffff85e.ucs,
                        CONCAT24(in_stack_fffffffffffff85c,in_stack_fffffffffffff858)));
    pcVar11 = QByteArray::constData((QByteArray *)0x119ddc);
    panic("Cannot open %s: %s",in_stack_fffffffffffff898,pcVar11);
    QByteArray::~QByteArray((QByteArray *)0x119dff);
    QString::~QString((QString *)0x119e0c);
    QByteArray::~QByteArray((QByteArray *)0x119e19);
  }
  local_f8 = 0xaaaaaaaaaaaaaaaa;
  QTextStream::QTextStream((QTextStream *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  if ((parseProvider(QString_const&)::tracedef == '\0') &&
     (iVar9 = __cxa_guard_acquire(&parseProvider(QString_const&)::tracedef), iVar9 != 0)) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (local_128,(Data *)0x0,L"^([A-Za-z][A-Za-z0-9_]*)\\((.*)\\)$",0x21);
    QString::QString((QString *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                     (DataPointer *)in_stack_fffffffffffff838);
    QFlags<QRegularExpression::PatternOption>::QFlags
              ((QFlags<QRegularExpression::PatternOption> *)
               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
               (PatternOption)((ulong)in_stack_fffffffffffff838 >> 0x20));
    options.super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
    super_QFlagsStorage<QRegularExpression::PatternOption>.i._2_2_ = in_stack_fffffffffffff85e.ucs;
    options.super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
    super_QFlagsStorage<QRegularExpression::PatternOption>.i._0_2_ = in_stack_fffffffffffff85c;
    QRegularExpression::QRegularExpression
              ((QRegularExpression *)in_stack_fffffffffffff850,(QString *)in_stack_fffffffffffff848,
               options);
    QString::~QString((QString *)0x119ef8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)
               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
    __cxa_atexit(QRegularExpression::~QRegularExpression,&parseProvider::tracedef,&__dso_handle);
    __cxa_guard_release(&parseProvider(QString_const&)::tracedef);
  }
  if ((parseProvider(QString_const&)::enumenddef == '\0') &&
     (iVar9 = __cxa_guard_acquire(&parseProvider(QString_const&)::enumenddef), iVar9 != 0)) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (local_160,(Data *)0x0,L"^} ?([A-Za-z][A-Za-z0-9_:]*);",0x1d);
    QString::QString((QString *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                     (DataPointer *)in_stack_fffffffffffff838);
    QFlags<QRegularExpression::PatternOption>::QFlags
              ((QFlags<QRegularExpression::PatternOption> *)
               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
               (PatternOption)((ulong)in_stack_fffffffffffff838 >> 0x20));
    options_00.super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
    super_QFlagsStorage<QRegularExpression::PatternOption>.i._2_2_ = in_stack_fffffffffffff85e.ucs;
    options_00.super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
    super_QFlagsStorage<QRegularExpression::PatternOption>.i._0_2_ = in_stack_fffffffffffff85c;
    QRegularExpression::QRegularExpression
              ((QRegularExpression *)in_stack_fffffffffffff850,(QString *)in_stack_fffffffffffff848,
               options_00);
    QString::~QString((QString *)0x119fe6);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)
               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
    __cxa_atexit(QRegularExpression::~QRegularExpression,&parseProvider::enumenddef,&__dso_handle);
    __cxa_guard_release(&parseProvider(QString_const&)::enumenddef);
  }
  if ((parseProvider(QString_const&)::enumdef == '\0') &&
     (iVar9 = __cxa_guard_acquire(&parseProvider(QString_const&)::enumdef), iVar9 != 0)) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (local_198,(Data *)0x0,L"^([A-Za-z][A-Za-z0-9_]*)( *= *([xabcdef0-9]*))?",0x2f);
    QString::QString((QString *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                     (DataPointer *)in_stack_fffffffffffff838);
    QFlags<QRegularExpression::PatternOption>::QFlags
              ((QFlags<QRegularExpression::PatternOption> *)
               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
               (PatternOption)((ulong)in_stack_fffffffffffff838 >> 0x20));
    options_01.super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
    super_QFlagsStorage<QRegularExpression::PatternOption>.i._2_2_ = in_stack_fffffffffffff85e.ucs;
    options_01.super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
    super_QFlagsStorage<QRegularExpression::PatternOption>.i._0_2_ = in_stack_fffffffffffff85c;
    QRegularExpression::QRegularExpression
              ((QRegularExpression *)in_stack_fffffffffffff850,(QString *)in_stack_fffffffffffff848,
               options_01);
    QString::~QString((QString *)0x11a0d4);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)
               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
    __cxa_atexit(QRegularExpression::~QRegularExpression,&parseProvider::enumdef,&__dso_handle);
    __cxa_guard_release(&parseProvider(QString_const&)::enumdef);
  }
  if ((parseProvider(QString_const&)::rangedef == '\0') &&
     (iVar9 = __cxa_guard_acquire(&parseProvider(QString_const&)::rangedef), iVar9 != 0)) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (local_1d0,(Data *)0x0,
               L"^RANGE\\(([A-Za-z][A-Za-z0-9_]*) ?, ?([0-9]*) ?... ?([0-9]*) ?\\)",0x3f);
    QString::QString((QString *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                     (DataPointer *)in_stack_fffffffffffff838);
    QFlags<QRegularExpression::PatternOption>::QFlags
              ((QFlags<QRegularExpression::PatternOption> *)
               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
               (PatternOption)((ulong)in_stack_fffffffffffff838 >> 0x20));
    options_02.super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
    super_QFlagsStorage<QRegularExpression::PatternOption>.i._2_2_ = in_stack_fffffffffffff85e.ucs;
    options_02.super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
    super_QFlagsStorage<QRegularExpression::PatternOption>.i._0_2_ = in_stack_fffffffffffff85c;
    QRegularExpression::QRegularExpression
              ((QRegularExpression *)in_stack_fffffffffffff850,(QString *)in_stack_fffffffffffff848,
               options_02);
    QString::~QString((QString *)0x11a1c2);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)
               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
    __cxa_atexit(QRegularExpression::~QRegularExpression,&parseProvider::rangedef,&__dso_handle);
    __cxa_guard_release(&parseProvider(QString_const&)::rangedef);
  }
  memset(in_RDI,0xaa,0x78);
  Provider::Provider((Provider *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  QFileInfo::QFileInfo((QFileInfo *)in_stack_fffffffffffff850,(QString *)in_stack_fffffffffffff848);
  QFileInfo::baseName(in_stack_fffffffffffff860);
  QString::operator=((QString *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                     &in_stack_fffffffffffff838->name);
  QString::~QString((QString *)0x11a264);
  QFileInfo::~QFileInfo((QFileInfo *)0x11a271);
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  memset(local_40,0xaa,0x38);
  TraceEnum::TraceEnum((TraceEnum *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  memset(&local_228,0,0x30);
  local_228 = 0xaaaaaaaaaaaaaaaa;
  local_220 = 0xaaaaaaaaaaaaaaaa;
  local_218 = 0xaaaaaaaaaaaaaaaa;
  local_210 = 0xaaaaaaaaaaaaaaaa;
  local_208 = 0xaaaaaaaaaaaaaaaa;
  local_200 = 0xaaaaaaaaaaaaaaaa;
  TraceFlags::TraceFlags
            ((TraceFlags *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  local_22c = 0;
  local_230 = std::numeric_limits<int>::max();
  local_234 = std::numeric_limits<int>::min();
  local_734 = CaseSensitive;
  while (bVar6 = QTextStream::atEnd((QTextStream *)
                                    CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840)),
        ((bVar6 ^ 0xffU) & 1) != 0) {
    local_250.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_250.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_250.d.size = -0x5555555555555556;
    QTextStream::readLine
              ((QTextStream *)
               CONCAT26(in_stack_fffffffffffff85e.ucs,
                        CONCAT24(in_stack_fffffffffffff85c,in_stack_fffffffffffff858)),
               (qint64)in_stack_fffffffffffff850);
    QString::trimmed(&in_stack_fffffffffffff838->name);
    QString::~QString((QString *)0x11a3e8);
    local_278 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffff848,
                           CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
    bVar6 = operator==((QString *)in_stack_fffffffffffff848,
                       (QLatin1StringView *)
                       CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
    if (bVar6) {
      bVar1 = true;
    }
    else {
      in_stack_fffffffffffff894 = in_stack_fffffffffffff894 & 0xffffff;
      if (bVar1) {
        local_288 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffff848,
                               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
        bVar6 = operator==((QString *)in_stack_fffffffffffff848,
                           (QLatin1StringView *)
                           CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
        in_stack_fffffffffffff894 = CONCAT13(bVar6,(int3)in_stack_fffffffffffff894);
      }
      if ((char)(in_stack_fffffffffffff894 >> 0x18) == '\0') {
        if (bVar1) {
          QList<QString>::append
                    ((QList<QString> *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840)
                     ,&in_stack_fffffffffffff838->name);
        }
        else {
          local_298 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)in_stack_fffffffffffff848,
                                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
          bVar6 = operator==((QString *)in_stack_fffffffffffff848,
                             (QLatin1StringView *)
                             CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
          if (bVar6) {
            bVar2 = true;
          }
          else {
            local_2a8 = Qt::Literals::StringLiterals::operator____L1
                                  ((char *)in_stack_fffffffffffff848,
                                   CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
            bVar6 = operator==((QString *)in_stack_fffffffffffff848,
                               (QLatin1StringView *)
                               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
            if (bVar6) {
              bVar3 = true;
            }
            else {
              Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffff848,
                         CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
              s_00.m_size._0_4_ = in_stack_fffffffffffff868;
              s_00.m_data = (char *)in_stack_fffffffffffff860;
              s_00.m_size._4_4_ = in_stack_fffffffffffff86c;
              bVar6 = QString::startsWith(&in_stack_fffffffffffff838->name,s_00,CaseInsensitive);
              if ((bVar6) && ((bVar2 || (bVar3)))) {
                local_2b0 = 0xaaaaaaaaaaaaaaaa;
                QFlags<QRegularExpression::MatchOption>::QFlags
                          ((QFlags<QRegularExpression::MatchOption> *)
                           CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                           (MatchOption)((ulong)in_stack_fffffffffffff838 >> 0x20));
                QRegularExpression::match
                          ((QRegularExpression *)
                           CONCAT17(in_stack_fffffffffffff887,
                                    CONCAT16(in_stack_fffffffffffff886,
                                             CONCAT15(in_stack_fffffffffffff885,
                                                      CONCAT14(in_stack_fffffffffffff884,
                                                               in_stack_fffffffffffff880)))),
                           in_stack_fffffffffffff878,(qsizetype)in_stack_fffffffffffff870,
                           in_stack_fffffffffffff86c,
                           (QFlagsStorageHelper<QRegularExpression::MatchOption,_4>)
                           SUB84((ulong)provider_00 >> 0x20,0));
                bVar6 = QRegularExpressionMatch::hasMatch((QRegularExpressionMatch *)0x11a63a);
                if (bVar6) {
                  iVar9 = (int)((ulong)in_stack_fffffffffffff848 >> 0x20);
                  if (bVar2) {
                    QRegularExpressionMatch::captured
                              ((QRegularExpressionMatch *)in_stack_fffffffffffff850,iVar9);
                    QString::operator=((QString *)
                                       CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840)
                                       ,&in_stack_fffffffffffff838->name);
                    QString::~QString((QString *)0x11a68d);
                    local_10 = minumumValueSize((int)in_stack_fffffffffffff850,
                                                (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
                    QList<TraceEnum>::push_back
                              ((QList<TraceEnum> *)
                               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                               (parameter_type)in_stack_fffffffffffff838);
                    memset(local_78,0,0x38);
                    TraceEnum::TraceEnum
                              ((TraceEnum *)
                               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
                    TraceEnum::operator=
                              ((TraceEnum *)
                               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                               (TraceEnum *)in_stack_fffffffffffff838);
                    TraceEnum::~TraceEnum
                              ((TraceEnum *)
                               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
                    bVar2 = false;
                  }
                  else {
                    QRegularExpressionMatch::captured
                              ((QRegularExpressionMatch *)in_stack_fffffffffffff850,iVar9);
                    QString::operator=((QString *)
                                       CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840)
                                       ,&in_stack_fffffffffffff838->name);
                    QString::~QString((QString *)0x11a749);
                    QList<TraceFlags>::push_back
                              ((QList<TraceFlags> *)
                               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                               (parameter_type)in_stack_fffffffffffff838);
                    memset(local_318,0,0x30);
                    TraceFlags::TraceFlags
                              ((TraceFlags *)
                               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
                    TraceFlags::operator=
                              ((TraceFlags *)
                               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                               (TraceFlags *)in_stack_fffffffffffff838);
                    TraceFlags::~TraceFlags
                              ((TraceFlags *)
                               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
                    bVar3 = false;
                  }
                  local_230 = std::numeric_limits<int>::max();
                  local_234 = std::numeric_limits<int>::min();
                }
                else {
                  QtPrivate::asString(in_RSI);
                  QString::toLocal8Bit
                            ((QString *)
                             CONCAT26(in_stack_fffffffffffff85e.ucs,
                                      CONCAT24(in_stack_fffffffffffff85c,in_stack_fffffffffffff858))
                            );
                  in_stack_fffffffffffff888 = QByteArray::constData((QByteArray *)0x11a7f1);
                  in_stack_fffffffffffff890 = local_734;
                  QtPrivate::asString(&local_250);
                  QString::toLocal8Bit
                            ((QString *)
                             CONCAT26(in_stack_fffffffffffff85e.ucs,
                                      CONCAT24(in_stack_fffffffffffff85c,in_stack_fffffffffffff858))
                            );
                  pcVar11 = QByteArray::constData((QByteArray *)0x11a82b);
                  panic("Syntax error while processing \'%s\' line %d:\n    \'%s\' end of enum/flags does not match"
                        ,in_stack_fffffffffffff888,(ulong)in_stack_fffffffffffff890,pcVar11);
                  QByteArray::~QByteArray((QByteArray *)0x11a852);
                  QByteArray::~QByteArray((QByteArray *)0x11a85f);
                }
                QRegularExpressionMatch::~QRegularExpressionMatch
                          ((QRegularExpressionMatch *)0x11a877);
              }
              else {
                bVar6 = QString::isEmpty((QString *)0x11a893);
                if (!bVar6) {
                  QChar::QChar<char16_t,_true>(local_34a,L'#');
                  bVar6 = QString::startsWith((QString *)in_stack_fffffffffffff848,
                                              in_stack_fffffffffffff85e,in_stack_fffffffffffff844);
                  if (!bVar6) {
                    flags = (MatchOption)((ulong)in_stack_fffffffffffff838 >> 0x20);
                    if ((bVar2) || (bVar3)) {
                      local_358 = 0xaaaaaaaaaaaaaaaa;
                      QFlags<QRegularExpression::MatchOption>::QFlags
                                ((QFlags<QRegularExpression::MatchOption> *)
                                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),flags
                                );
                      QRegularExpression::match
                                ((QRegularExpression *)
                                 CONCAT17(in_stack_fffffffffffff887,
                                          CONCAT16(in_stack_fffffffffffff886,
                                                   CONCAT15(in_stack_fffffffffffff885,
                                                            CONCAT14(in_stack_fffffffffffff884,
                                                                     in_stack_fffffffffffff880)))),
                                 in_stack_fffffffffffff878,(qsizetype)in_stack_fffffffffffff870,
                                 in_stack_fffffffffffff86c,
                                 (QFlagsStorageHelper<QRegularExpression::MatchOption,_4>)
                                 SUB84((ulong)provider_00 >> 0x20,0));
                      in_stack_fffffffffffff886 = 0;
                      in_stack_fffffffffffff887 = in_stack_fffffffffffff886;
                      if (bVar2) {
                        QArrayDataPointer<char16_t>::QArrayDataPointer
                                  (local_390,(Data *)0x0,L"RANGE",5);
                        QString::QString((QString *)
                                         CONCAT44(in_stack_fffffffffffff844,
                                                  in_stack_fffffffffffff840),
                                         (DataPointer *)in_stack_fffffffffffff838);
                        in_stack_fffffffffffff886 =
                             QString::startsWith((QString *)in_stack_fffffffffffff848,
                                                 (QString *)
                                                 CONCAT44(in_stack_fffffffffffff844,
                                                          in_stack_fffffffffffff840),
                                                 (CaseSensitivity)
                                                 ((ulong)in_stack_fffffffffffff838 >> 0x20));
                        in_stack_fffffffffffff887 = in_stack_fffffffffffff886;
                        QString::~QString((QString *)0x11aa02);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer
                                  ((QArrayDataPointer<char16_t> *)
                                   CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
                      }
                      if ((in_stack_fffffffffffff886 & 1) == 0) {
                        bVar6 = QRegularExpressionMatch::hasMatch
                                          ((QRegularExpressionMatch *)0x11ac2b);
                        if (bVar6) {
                          bVar6 = QRegularExpressionMatch::hasCaptured
                                            ((QRegularExpressionMatch *)in_stack_fffffffffffff848,
                                             in_stack_fffffffffffff844);
                          if (bVar6) {
                            if (bVar2) {
                              local_428 = 0xaaaaaaaaaaaaaaaa;
                              local_420 = 0xaaaaaaaaaaaaaaaa;
                              local_418 = 0xaaaaaaaaaaaaaaaa;
                              local_410[0] = 0xaaaaaaaaaaaaaaaa;
                              TraceEnum::EnumValue::EnumValue((EnumValue *)0x11aca6);
                              QRegularExpressionMatch::captured
                                        ((QRegularExpressionMatch *)in_stack_fffffffffffff850,
                                         (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
                              QString::operator=((QString *)
                                                 CONCAT44(in_stack_fffffffffffff844,
                                                          in_stack_fffffffffffff840),
                                                 &in_stack_fffffffffffff838->name);
                              QString::~QString((QString *)0x11ace2);
                              QRegularExpressionMatch::captured
                                        ((QRegularExpressionMatch *)in_stack_fffffffffffff850,
                                         (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
                              iVar9 = QString::toInt((QString *)in_stack_fffffffffffff848,
                                                     (bool *)CONCAT44(in_stack_fffffffffffff844,
                                                                      in_stack_fffffffffffff840),
                                                     (int)((ulong)in_stack_fffffffffffff838 >> 0x20)
                                                    );
                              local_410[0] = CONCAT44(local_410[0]._4_4_,iVar9);
                              QString::~QString((QString *)0x11ad26);
                              uVar4 = local_410[0];
                              local_410[0] = local_410[0] & 0xffffffff;
                              uVar5 = local_410[0];
                              local_410[0]._0_4_ = (int)uVar4;
                              local_22c = (int)local_410[0] + 1;
                              local_410[0] = uVar5;
                              QList<TraceEnum::EnumValue>::push_back
                                        ((QList<TraceEnum::EnumValue> *)
                                         CONCAT44(in_stack_fffffffffffff844,
                                                  in_stack_fffffffffffff840),
                                         (parameter_type)in_stack_fffffffffffff838);
                              piVar12 = qMax<int>(&local_234,(int *)local_410);
                              local_234 = *piVar12;
                              piVar12 = qMin<int>(&local_230,(int *)local_410);
                              local_230 = *piVar12;
                              TraceEnum::EnumValue::~EnumValue((EnumValue *)0x11adac);
                            }
                            else {
                              local_98 = 0xaaaaaaaaaaaaaaaa;
                              local_90 = 0xaaaaaaaaaaaaaaaa;
                              local_88 = 0xaaaaaaaaaaaaaaaa;
                              local_80 = 0xaaaaaaaaaaaaaaaa;
                              TraceFlags::FlagValue::FlagValue((FlagValue *)0x11adfa);
                              QRegularExpressionMatch::captured
                                        ((QRegularExpressionMatch *)in_stack_fffffffffffff850,
                                         (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
                              QString::operator=((QString *)
                                                 CONCAT44(in_stack_fffffffffffff844,
                                                          in_stack_fffffffffffff840),
                                                 &in_stack_fffffffffffff838->name);
                              QString::~QString((QString *)0x11ae36);
                              QRegularExpressionMatch::captured
                                        ((QRegularExpressionMatch *)in_stack_fffffffffffff850,
                                         (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
                              QArrayDataPointer<char16_t>::QArrayDataPointer
                                        (local_4b8,(Data *)0x0,L"0x",2);
                              QString::QString((QString *)
                                               CONCAT44(in_stack_fffffffffffff844,
                                                        in_stack_fffffffffffff840),
                                               (DataPointer *)in_stack_fffffffffffff838);
                              in_stack_fffffffffffff885 =
                                   QString::startsWith((QString *)in_stack_fffffffffffff848,
                                                       (QString *)
                                                       CONCAT44(in_stack_fffffffffffff844,
                                                                in_stack_fffffffffffff840),
                                                       (CaseSensitivity)
                                                       ((ulong)in_stack_fffffffffffff838 >> 0x20));
                              QString::~QString((QString *)0x11aedd);
                              QArrayDataPointer<char16_t>::~QArrayDataPointer
                                        ((QArrayDataPointer<char16_t> *)
                                         CONCAT44(in_stack_fffffffffffff844,
                                                  in_stack_fffffffffffff840));
                              QString::~QString((QString *)0x11aef7);
                              iVar9 = (int)((ulong)in_stack_fffffffffffff848 >> 0x20);
                              if ((in_stack_fffffffffffff885 & 1) == 0) {
                                QRegularExpressionMatch::captured
                                          ((QRegularExpressionMatch *)in_stack_fffffffffffff850,
                                           iVar9);
                                iVar9 = QString::toInt((QString *)in_stack_fffffffffffff848,
                                                       (bool *)CONCAT44(in_stack_fffffffffffff844,
                                                                        in_stack_fffffffffffff840),
                                                       (int)((ulong)in_stack_fffffffffffff838 >>
                                                            0x20));
                                local_80 = CONCAT44(local_80._4_4_,iVar9);
                                QString::~QString((QString *)0x11af8b);
                              }
                              else {
                                QRegularExpressionMatch::captured
                                          ((QRegularExpressionMatch *)in_stack_fffffffffffff850,
                                           iVar9);
                                iVar9 = QString::toInt((QString *)in_stack_fffffffffffff848,
                                                       (bool *)CONCAT44(in_stack_fffffffffffff844,
                                                                        in_stack_fffffffffffff840),
                                                       (int)((ulong)in_stack_fffffffffffff838 >>
                                                            0x20));
                                local_80 = CONCAT44(local_80._4_4_,iVar9);
                                QString::~QString((QString *)0x11af45);
                              }
                              bVar6 = isPow2OrZero((quint32)local_80);
                              if (bVar6) {
                                qVar10 = pow2Log2(0);
                                local_80 = CONCAT44(local_80._4_4_,qVar10);
                                QList<TraceFlags::FlagValue>::push_back
                                          ((QList<TraceFlags::FlagValue> *)
                                           CONCAT44(in_stack_fffffffffffff844,
                                                    in_stack_fffffffffffff840),
                                           (parameter_type)in_stack_fffffffffffff838);
                              }
                              else {
                                QtPrivate::asString(in_RSI);
                                QString::toLocal8Bit
                                          ((QString *)
                                           CONCAT26(in_stack_fffffffffffff85e.ucs,
                                                    CONCAT24(in_stack_fffffffffffff85c,
                                                             in_stack_fffffffffffff858)));
                                in_stack_fffffffffffff878 =
                                     (QString *)QByteArray::constData((QByteArray *)0x11afc9);
                                in_stack_fffffffffffff880 = local_734;
                                QtPrivate::asString(&local_250);
                                QString::toLocal8Bit
                                          ((QString *)
                                           CONCAT26(in_stack_fffffffffffff85e.ucs,
                                                    CONCAT24(in_stack_fffffffffffff85c,
                                                             in_stack_fffffffffffff858)));
                                pcVar11 = QByteArray::constData((QByteArray *)0x11b003);
                                printf("Warning: \'%s\' line %d:\n    \'%s\' flag value is not power of two.\n"
                                       ,in_stack_fffffffffffff878,(ulong)in_stack_fffffffffffff880,
                                       pcVar11);
                                QByteArray::~QByteArray((QByteArray *)0x11b02a);
                                QByteArray::~QByteArray((QByteArray *)0x11b037);
                              }
                              TraceFlags::FlagValue::~FlagValue((FlagValue *)0x11b072);
                            }
                          }
                          else {
                            piVar12 = qMax<int>(&local_234,&local_22c);
                            local_234 = *piVar12;
                            piVar12 = qMin<int>(&local_230,&local_22c);
                            local_230 = *piVar12;
                            if (bVar2) {
                              in_stack_fffffffffffff870 = auStack_28;
                              QRegularExpressionMatch::captured
                                        ((QRegularExpressionMatch *)in_stack_fffffffffffff850,
                                         (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
                              local_520 = local_22c;
                              local_51c = 0;
                              local_22c = local_22c + 1;
                              QList<TraceEnum::EnumValue>::push_back
                                        ((QList<TraceEnum::EnumValue> *)
                                         CONCAT44(in_stack_fffffffffffff844,
                                                  in_stack_fffffffffffff840),
                                         (rvalue_ref)in_stack_fffffffffffff838);
                              TraceEnum::EnumValue::~EnumValue((EnumValue *)0x11b129);
                            }
                            else {
                              QtPrivate::asString(in_RSI);
                              QString::toLocal8Bit
                                        ((QString *)
                                         CONCAT26(in_stack_fffffffffffff85e.ucs,
                                                  CONCAT24(in_stack_fffffffffffff85c,
                                                           in_stack_fffffffffffff858)));
                              in_stack_fffffffffffff860 =
                                   (QFileInfo *)QByteArray::constData((QByteArray *)0x11b158);
                              in_stack_fffffffffffff86c = local_734;
                              QtPrivate::asString(&local_250);
                              QString::toLocal8Bit
                                        ((QString *)
                                         CONCAT26(in_stack_fffffffffffff85e.ucs,
                                                  CONCAT24(in_stack_fffffffffffff85c,
                                                           in_stack_fffffffffffff858)));
                              pcVar11 = QByteArray::constData((QByteArray *)0x11b192);
                              panic("Syntax error while processing \'%s\' line %d:\n    \'%s\' flags value not set"
                                    ,in_stack_fffffffffffff860,(ulong)in_stack_fffffffffffff86c,
                                    pcVar11);
                              QByteArray::~QByteArray((QByteArray *)0x11b1b9);
                              QByteArray::~QByteArray((QByteArray *)0x11b1c6);
                            }
                          }
                        }
                        else {
                          QtPrivate::asString(in_RSI);
                          QString::toLocal8Bit
                                    ((QString *)
                                     CONCAT26(in_stack_fffffffffffff85e.ucs,
                                              CONCAT24(in_stack_fffffffffffff85c,
                                                       in_stack_fffffffffffff858)));
                          in_stack_fffffffffffff850 =
                               (QIODevice *)QByteArray::constData((QByteArray *)0x11b1f7);
                          in_stack_fffffffffffff85c = (undefined2)local_734;
                          in_stack_fffffffffffff85e.ucs = (char16_t)(local_734 >> 0x10);
                          QtPrivate::asString(&local_250);
                          QString::toLocal8Bit
                                    ((QString *)
                                     CONCAT26(in_stack_fffffffffffff85e.ucs,
                                              CONCAT24(in_stack_fffffffffffff85c,
                                                       in_stack_fffffffffffff858)));
                          pcVar11 = QByteArray::constData((QByteArray *)0x11b231);
                          panic("Syntax error while processing \'%s\' line %d:\n    \'%s\' enum/flags does not match"
                                ,in_stack_fffffffffffff850,
                                (ulong)CONCAT22(in_stack_fffffffffffff85e.ucs,
                                                in_stack_fffffffffffff85c),pcVar11);
                          QByteArray::~QByteArray((QByteArray *)0x11b258);
                          QByteArray::~QByteArray((QByteArray *)0x11b265);
                        }
                      }
                      else {
                        local_398 = 0xaaaaaaaaaaaaaaaa;
                        QFlags<QRegularExpression::MatchOption>::QFlags
                                  ((QFlags<QRegularExpression::MatchOption> *)
                                   CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                                   (MatchOption)((ulong)in_stack_fffffffffffff838 >> 0x20));
                        QRegularExpression::match
                                  ((QRegularExpression *)
                                   CONCAT17(in_stack_fffffffffffff887,
                                            CONCAT16(in_stack_fffffffffffff886,
                                                     CONCAT15(in_stack_fffffffffffff885,
                                                              CONCAT14(in_stack_fffffffffffff884,
                                                                       in_stack_fffffffffffff880))))
                                   ,in_stack_fffffffffffff878,(qsizetype)in_stack_fffffffffffff870,
                                   in_stack_fffffffffffff86c,
                                   (QFlagsStorageHelper<QRegularExpression::MatchOption,_4>)
                                   SUB84((ulong)provider_00 >> 0x20,0));
                        bVar6 = QRegularExpressionMatch::hasMatch
                                          ((QRegularExpressionMatch *)0x11aa7b);
                        if (bVar6) {
                          local_3c0 = 0xaaaaaaaaaaaaaaaa;
                          local_3b8 = 0xaaaaaaaaaaaaaaaa;
                          local_3b0 = 0xaaaaaaaaaaaaaaaa;
                          local_3a8[0] = -0x55555556;
                          local_3a8[1] = -0x55555556;
                          TraceEnum::EnumValue::EnumValue((EnumValue *)0x11aacd);
                          QRegularExpressionMatch::captured
                                    ((QRegularExpressionMatch *)in_stack_fffffffffffff850,
                                     (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
                          QString::operator=((QString *)
                                             CONCAT44(in_stack_fffffffffffff844,
                                                      in_stack_fffffffffffff840),
                                             &in_stack_fffffffffffff838->name);
                          QString::~QString((QString *)0x11ab09);
                          QRegularExpressionMatch::captured
                                    ((QRegularExpressionMatch *)in_stack_fffffffffffff850,
                                     (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
                          iVar9 = QString::toInt((QString *)in_stack_fffffffffffff848,
                                                 (bool *)CONCAT44(in_stack_fffffffffffff844,
                                                                  in_stack_fffffffffffff840),
                                                 (int)((ulong)in_stack_fffffffffffff838 >> 0x20));
                          local_3a8[0] = iVar9;
                          QString::~QString((QString *)0x11ab4d);
                          QRegularExpressionMatch::captured
                                    ((QRegularExpressionMatch *)in_stack_fffffffffffff850,
                                     (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
                          iVar9 = QString::toInt((QString *)in_stack_fffffffffffff848,
                                                 (bool *)CONCAT44(in_stack_fffffffffffff844,
                                                                  in_stack_fffffffffffff840),
                                                 (int)((ulong)in_stack_fffffffffffff838 >> 0x20));
                          local_3a8[1] = iVar9;
                          QString::~QString((QString *)0x11ab91);
                          local_22c = local_3a8[1] + 1;
                          QList<TraceEnum::EnumValue>::push_back
                                    ((QList<TraceEnum::EnumValue> *)
                                     CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                                     (parameter_type)in_stack_fffffffffffff838);
                          piVar12 = qMax<int>(&local_234,local_3a8 + 1);
                          local_234 = *piVar12;
                          piVar12 = qMin<int>(&local_230,local_3a8);
                          local_230 = *piVar12;
                          TraceEnum::EnumValue::~EnumValue((EnumValue *)0x11ac0c);
                        }
                        QRegularExpressionMatch::~QRegularExpressionMatch
                                  ((QRegularExpressionMatch *)0x11ac19);
                      }
                      QRegularExpressionMatch::~QRegularExpressionMatch
                                ((QRegularExpressionMatch *)0x11b27f);
                    }
                    else {
                      local_5a0 = 0xaaaaaaaaaaaaaaaa;
                      QFlags<QRegularExpression::MatchOption>::QFlags
                                ((QFlags<QRegularExpression::MatchOption> *)
                                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),flags
                                );
                      QRegularExpression::match
                                ((QRegularExpression *)
                                 CONCAT17(in_stack_fffffffffffff887,
                                          CONCAT16(in_stack_fffffffffffff886,
                                                   CONCAT15(in_stack_fffffffffffff885,
                                                            CONCAT14(in_stack_fffffffffffff884,
                                                                     in_stack_fffffffffffff880)))),
                                 in_stack_fffffffffffff878,(qsizetype)in_stack_fffffffffffff870,
                                 in_stack_fffffffffffff86c,
                                 (QFlagsStorageHelper<QRegularExpression::MatchOption,_4>)
                                 SUB84((ulong)provider_00 >> 0x20,0));
                      bVar6 = QRegularExpressionMatch::hasMatch((QRegularExpressionMatch *)0x11b2da)
                      ;
                      if (bVar6) {
                        local_5c0 = 0xaaaaaaaaaaaaaaaa;
                        local_5b8 = 0xaaaaaaaaaaaaaaaa;
                        local_5b0 = 0xaaaaaaaaaaaaaaaa;
                        QRegularExpressionMatch::captured
                                  ((QRegularExpressionMatch *)in_stack_fffffffffffff850,
                                   (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
                        local_5d8 = 0xaaaaaaaaaaaaaaaa;
                        local_5d0 = 0xaaaaaaaaaaaaaaaa;
                        local_5c8 = 0xaaaaaaaaaaaaaaaa;
                        cs = (CaseSensitivity)((ulong)in_stack_fffffffffffff848 >> 0x20);
                        QRegularExpressionMatch::captured
                                  ((QRegularExpressionMatch *)in_stack_fffffffffffff850,cs);
                        local_5f0 = 0xaaaaaaaaaaaaaaaa;
                        local_5e8 = 0xaaaaaaaaaaaaaaaa;
                        local_5e0 = 0xaaaaaaaaaaaaaaaa;
                        QChar::QChar<char16_t,_true>(&local_5f2,L',');
                        QFlags<Qt::SplitBehaviorFlags>::QFlags
                                  ((QFlags<Qt::SplitBehaviorFlags> *)
                                   CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                                   (SplitBehaviorFlags)((ulong)in_stack_fffffffffffff838 >> 0x20));
                        QString::split((QString *)in_stack_fffffffffffff850,
                                       (QChar)(char16_t)((ulong)in_stack_fffffffffffff878 >> 0x30),
                                       (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)
                                       SUB84(in_stack_fffffffffffff878,0),cs);
                        in_stack_fffffffffffff848 = (QIODevice *)&in_RDI->tracepoints;
                        parseTracepoint(provider_00,&in_RDI->name,in_stack_fffffffffffff898,
                                        (QString *)
                                        CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890
                                                ),(int)((ulong)in_stack_fffffffffffff888 >> 0x20));
                        QList<Tracepoint>::operator<<
                                  ((QList<Tracepoint> *)
                                   CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                                   in_stack_fffffffffffff838);
                        Tracepoint::~Tracepoint
                                  ((Tracepoint *)
                                   CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
                        QList<QString>::~QList((QList<QString> *)0x11b459);
                        QString::~QString((QString *)0x11b466);
                        QString::~QString((QString *)0x11b473);
                      }
                      else {
                        QtPrivate::asString(in_RSI);
                        QString::toLocal8Bit
                                  ((QString *)
                                   CONCAT26(in_stack_fffffffffffff85e.ucs,
                                            CONCAT24(in_stack_fffffffffffff85c,
                                                     in_stack_fffffffffffff858)));
                        in_stack_fffffffffffff838 =
                             (rvalue_ref)QByteArray::constData((QByteArray *)0x11b4a2);
                        in_stack_fffffffffffff844 = local_734;
                        QtPrivate::asString(&local_250);
                        QString::toLocal8Bit
                                  ((QString *)
                                   CONCAT26(in_stack_fffffffffffff85e.ucs,
                                            CONCAT24(in_stack_fffffffffffff85c,
                                                     in_stack_fffffffffffff858)));
                        pcVar11 = QByteArray::constData((QByteArray *)0x11b4db);
                        panic("Syntax error while processing \'%s\' line %d:\n    \'%s\' does not look like a tracepoint definition"
                              ,in_stack_fffffffffffff838,(ulong)in_stack_fffffffffffff844,pcVar11);
                        QByteArray::~QByteArray((QByteArray *)0x11b501);
                        QByteArray::~QByteArray((QByteArray *)0x11b50e);
                      }
                      QRegularExpressionMatch::~QRegularExpressionMatch
                                ((QRegularExpressionMatch *)0x11b51b);
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        bVar1 = false;
      }
    }
    QString::~QString((QString *)0x11b533);
    local_734 = local_734 + CaseSensitive;
  }
  if (bVar1) {
    QtPrivate::asString(in_RSI);
    QString::toLocal8Bit
              ((QString *)
               CONCAT26(in_stack_fffffffffffff85e.ucs,
                        CONCAT24(in_stack_fffffffffffff85c,in_stack_fffffffffffff858)));
    pcVar11 = QByteArray::constData((QByteArray *)0x11b58e);
    panic("Syntax error while processing \'%s\': no closing brace found for prefix text block",
          pcVar11);
    QByteArray::~QByteArray((QByteArray *)0x11b5ac);
  }
  TraceFlags::~TraceFlags
            ((TraceFlags *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  TraceEnum::~TraceEnum((TraceEnum *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  QTextStream::~QTextStream
            ((QTextStream *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  QFile::~QFile((QFile *)0x11b607);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return provider_00;
  }
  __stack_chk_fail();
}

Assistant:

Provider parseProvider(const QString &filename)
{
    QFile f(filename);

    if (!f.open(QIODevice::ReadOnly | QIODevice::Text))
        panic("Cannot open %s: %s", qPrintable(filename), qPrintable(f.errorString()));

    QTextStream s(&f);

    static const QRegularExpression tracedef(QStringLiteral("^([A-Za-z][A-Za-z0-9_]*)\\((.*)\\)$"));
    static const QRegularExpression enumenddef(QStringLiteral("^} ?([A-Za-z][A-Za-z0-9_:]*);"));
    static const QRegularExpression enumdef(QStringLiteral("^([A-Za-z][A-Za-z0-9_]*)( *= *([xabcdef0-9]*))?"));
    static const QRegularExpression rangedef(QStringLiteral("^RANGE\\(([A-Za-z][A-Za-z0-9_]*) ?, ?([0-9]*) ?... ?([0-9]*) ?\\)"));

    Provider provider;
    provider.name = QFileInfo(filename).baseName();

    bool parsingPrefixText = false;
    bool parsingEnum = false;
    bool parsingFlags = false;
    TraceEnum currentEnum;
    TraceFlags currentFlags;
    int currentEnumValue = 0;
    int minEnumValue = std::numeric_limits<int>::max();
    int maxEnumValue = std::numeric_limits<int>::min();
    for (int lineNumber = 1; !s.atEnd(); ++lineNumber) {
        QString line = s.readLine().trimmed();

        if (line == "{"_L1) {
            parsingPrefixText = true;
            continue;
        } else if (parsingPrefixText && line == "}"_L1) {
            parsingPrefixText = false;
            continue;
        } else if (parsingPrefixText) {
            provider.prefixText.append(line);
            continue;
        } else if (line == "ENUM {"_L1) {
            parsingEnum = true;
            continue;
        } else if (line == "FLAGS {"_L1) {
            parsingFlags = true;
            continue;
        } else if (line.startsWith("}"_L1) && (parsingEnum || parsingFlags)) {
            auto match = enumenddef.match(line);
            if (match.hasMatch()) {
                if (parsingEnum) {
                    currentEnum.name = match.captured(1);
                    currentEnum.valueSize = minumumValueSize(minEnumValue, maxEnumValue);
                    provider.enumerations.push_back(currentEnum);
                    currentEnum = TraceEnum();
                    parsingEnum = false;
                } else {
                    currentFlags.name = match.captured(1);
                    provider.flags.push_back(currentFlags);
                    currentFlags = TraceFlags();
                    parsingFlags = false;
                }

                minEnumValue = std::numeric_limits<int>::max();
                maxEnumValue = std::numeric_limits<int>::min();
            } else {
                panic("Syntax error while processing '%s' line %d:\n"
                      "    '%s' end of enum/flags does not match",
                      qPrintable(filename), lineNumber,
                      qPrintable(line));
            }

            continue;
        }

        if (line.isEmpty() || line.startsWith(u'#'))
            continue;

        if (parsingEnum || parsingFlags) {
            auto m = enumdef.match(line);
            if (parsingEnum && line.startsWith(QStringLiteral("RANGE"))) {
                auto m = rangedef.match(line);
                if (m.hasMatch()) {
                    TraceEnum::EnumValue value;
                    value.name = m.captured(1);
                    value.value = m.captured(2).toInt();
                    value.range = m.captured(3).toInt();
                    currentEnumValue = value.range + 1;
                    currentEnum.values.push_back(value);
                    maxEnumValue = qMax(maxEnumValue, value.range);
                    minEnumValue = qMin(minEnumValue, value.value);
                }
            } else if (m.hasMatch()) {
                if (m.hasCaptured(3)) {
                    if (parsingEnum) {
                        TraceEnum::EnumValue value;
                        value.name = m.captured(1);
                        value.value = m.captured(3).toInt();
                        value.range = 0;
                        currentEnumValue = value.value + 1;
                        currentEnum.values.push_back(value);
                        maxEnumValue = qMax(maxEnumValue, value.value);
                        minEnumValue = qMin(minEnumValue, value.value);
                    } else {
                        TraceFlags::FlagValue value;
                        value.name = m.captured(1);
                        if (m.captured(3).startsWith(QStringLiteral("0x")))
                            value.value = m.captured(3).toInt(nullptr, 16);
                        else
                            value.value = m.captured(3).toInt();
                        if (!isPow2OrZero(value.value)) {
                            printf("Warning: '%s' line %d:\n"
                                  "    '%s' flag value is not power of two.\n",
                                  qPrintable(filename), lineNumber,
                                  qPrintable(line));
                        } else {
                            value.value = pow2Log2(value.value);
                            currentFlags.values.push_back(value);
                        }
                    }
                } else {
                    maxEnumValue = qMax(maxEnumValue, currentEnumValue);
                    minEnumValue = qMin(minEnumValue, currentEnumValue);
                    if (parsingEnum) {
                        currentEnum.values.push_back({m.captured(0), currentEnumValue++, 0});
                    } else {
                        panic("Syntax error while processing '%s' line %d:\n"
                              "    '%s' flags value not set",
                              qPrintable(filename), lineNumber,
                              qPrintable(line));
                    }
                }
            } else {
                panic("Syntax error while processing '%s' line %d:\n"
                      "    '%s' enum/flags does not match",
                      qPrintable(filename), lineNumber,
                      qPrintable(line));
            }
            continue;
        }

        auto match = tracedef.match(line);
        if (match.hasMatch()) {
            const QString name = match.captured(1);
            const QString argsString = match.captured(2);
            const QStringList args = argsString.split(u',', Qt::SkipEmptyParts);

            provider.tracepoints << parseTracepoint(provider, name, args, filename, lineNumber);
        } else {
            panic("Syntax error while processing '%s' line %d:\n"
                  "    '%s' does not look like a tracepoint definition",
                  qPrintable(filename), lineNumber,
                  qPrintable(line));
        }
    }

    if (parsingPrefixText) {
        panic("Syntax error while processing '%s': "
              "no closing brace found for prefix text block",
              qPrintable(filename));
    }

#ifdef TRACEGEN_DEBUG
    qDebug() << provider.prefixText;
    for (auto i = provider.tracepoints.constBegin(); i != provider.tracepoints.constEnd(); ++i)
        dumpTracepoint(*i);
#endif

    return provider;
}